

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binjgb.c
# Opt level: O0

int main(int argc,char **argv)

{
  Result RVar1;
  Bool BVar2;
  EmulatorEvent EVar3;
  char *filename;
  ulong uVar4;
  bool bVar5;
  f64 delta_ms;
  EmulatorEvent event;
  f64 refresh_ms;
  char *save_filename;
  HostInit host_init;
  EmulatorInit emulator_init;
  FileData rom;
  int result;
  char **argv_local;
  int argc_local;
  
  rom.size._4_4_ = 1;
  read_ini_file();
  parse_arguments(argc,argv);
  RVar1 = file_read_aligned(s_rom_filename,0x8000,(FileData *)&emulator_init.force_dmg);
  if (RVar1 == OK) {
    memset(&host_init.use_sgb_border,0,0x28);
    host_init.use_sgb_border = emulator_init.force_dmg;
    host_init._92_4_ = emulator_init.cgb_color_curve;
    emulator_init.rom.size._0_4_ = s_audio_frequency;
    emulator_init.rom.size._4_4_ = s_audio_frames;
    emulator_init.audio_frequency = s_random_seed;
    emulator_init.audio_frames = s_builtin_palette;
    emulator_init.random_seed = s_force_dmg;
    emulator_init.builtin_palette = s_cgb_color_curve;
    e = emulator_new((EmulatorInit *)&host_init.use_sgb_border);
    if (e != (Emulator *)0x0) {
      memset(&save_filename,0,0x60);
      host_init.hooks.audio_buffer_full = key_down;
      host_init.hooks.key_down = key_up;
      host_init.hooks.key_up._0_4_ = s_render_scale;
      host_init.hooks.key_up._4_4_ = s_audio_frequency;
      host_init.render_scale = s_audio_frames;
      host_init.audio_frequency = (int)s_audio_volume;
      host_init.rewind.buffer_capacity._0_4_ = s_rewind_frames_per_base_state;
      host_init._56_8_ = (ulong)s_rewind_buffer_capacity_megabytes << 0x14;
      host_init.rewind._8_8_ = s_read_joypad_filename;
      host_init.joypad_filename._0_4_ = s_use_sgb_border;
      host = host_new((HostInit *)&save_filename,e);
      if (host != (Host *)0x0) {
        filename = replace_extension(s_rom_filename,".sav");
        s_save_state_filename = replace_extension(s_rom_filename,".state");
        emulator_read_ext_ram_from_file(e,filename);
        s_overlay.texture = host_create_texture(host,0xa0,0x90,HOST_TEXTURE_FORMAT_RGBA);
        delta_ms = host_get_monitor_refresh_ms(host);
        while( true ) {
          bVar5 = false;
          if (s_running != FALSE) {
            BVar2 = host_poll_events(host);
            bVar5 = BVar2 != FALSE;
          }
          if (!bVar5) break;
          if (s_rewinding == FALSE) {
            if (s_paused == FALSE) {
              EVar3 = host_run_ms(host,delta_ms);
              if ((EVar3 & 0x10) != 0) {
                set_status_text("invalid opcode!");
                s_paused = TRUE;
              }
              if (s_step_frame != FALSE) {
                host_reset_audio(host);
                s_paused = TRUE;
                s_step_frame = FALSE;
              }
            }
          }
          else {
            uVar4 = (ulong)((float)s_rewind_scale * 70224.0);
            rewind_by(uVar4 | (long)((float)s_rewind_scale * 70224.0 - 9.223372e+18) &
                              (long)uVar4 >> 0x3f);
          }
          host_begin_video(host);
          update_overlay();
          host_end_video(host);
        }
        if (s_write_joypad_filename == (char *)0x0) {
          emulator_write_ext_ram_to_file(e,filename);
        }
        else {
          host_write_joypad_to_file(host,s_write_joypad_filename);
        }
        rom.size._4_4_ = 0;
      }
    }
  }
  if (host != (Host *)0x0) {
    host_delete(host);
  }
  if (e != (Emulator *)0x0) {
    emulator_delete(e);
  }
  return rom.size._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  int result = 1;

  read_ini_file();

  parse_arguments(argc, argv);

  FileData rom;
  CHECK(SUCCESS(file_read_aligned(s_rom_filename, MINIMUM_ROM_SIZE, &rom)));

  EmulatorInit emulator_init;
  ZERO_MEMORY(emulator_init);
  emulator_init.rom = rom;
  emulator_init.audio_frequency = s_audio_frequency;
  emulator_init.audio_frames = s_audio_frames;
  emulator_init.random_seed = s_random_seed;
  emulator_init.builtin_palette = s_builtin_palette;
  emulator_init.force_dmg = s_force_dmg;
  emulator_init.cgb_color_curve = s_cgb_color_curve;
  e = emulator_new(&emulator_init);
  CHECK(e != NULL);

  HostInit host_init;
  ZERO_MEMORY(host_init);
  host_init.hooks.key_down = key_down;
  host_init.hooks.key_up = key_up;
  host_init.render_scale = s_render_scale;
  host_init.audio_frequency = s_audio_frequency;
  host_init.audio_frames = s_audio_frames;
  host_init.audio_volume = s_audio_volume;
  host_init.rewind.frames_per_base_state = s_rewind_frames_per_base_state;
  host_init.rewind.buffer_capacity = s_rewind_buffer_capacity_megabytes * MEGABYTES(1);
  host_init.joypad_filename = s_read_joypad_filename;
  host_init.use_sgb_border = s_use_sgb_border;
  host = host_new(&host_init, e);
  CHECK(host != NULL);

  const char* save_filename = replace_extension(s_rom_filename, SAVE_EXTENSION);
  s_save_state_filename =
      replace_extension(s_rom_filename, SAVE_STATE_EXTENSION);
  emulator_read_ext_ram_from_file(e, save_filename);

  s_overlay.texture = host_create_texture(host, SCREEN_WIDTH, SCREEN_HEIGHT,
                                          HOST_TEXTURE_FORMAT_RGBA);

  f64 refresh_ms = host_get_monitor_refresh_ms(host);
  while (s_running && host_poll_events(host)) {
    if (s_rewinding) {
      rewind_by((Ticks)(PPU_FRAME_TICKS * s_rewind_scale));
    } else if (!s_paused) {
      EmulatorEvent event = host_run_ms(host, refresh_ms);
      if (event & EMULATOR_EVENT_INVALID_OPCODE) {
        set_status_text("invalid opcode!");
        s_paused = TRUE;
      }
      if (s_step_frame) {
        host_reset_audio(host);
        s_paused = TRUE;
        s_step_frame = FALSE;
      }
    }

    host_begin_video(host);
    update_overlay();
    host_end_video(host);
  }

  if (s_write_joypad_filename) {
    host_write_joypad_to_file(host, s_write_joypad_filename);
  } else {
    emulator_write_ext_ram_to_file(e, save_filename);
  }

  result = 0;
error:
  if (host) {
    host_delete(host);
  }
  if (e) {
    emulator_delete(e);
  }
  return result;
}